

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerMSL::ensure_member_packing_rules_msl
          (CompilerMSL *this,SPIRType *ib_type,uint32_t index)

{
  int iVar1;
  uint *puVar2;
  size_t sVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  uint32_t uVar7;
  uint uVar8;
  uint32_t uVar9;
  ID id;
  SPIRType *pSVar10;
  CompilerError *this_00;
  ulong uVar11;
  byte bVar12;
  ulong uVar13;
  uint32_t index_00;
  SPIRType physical_type;
  undefined1 local_180 [192];
  uint *local_c0;
  size_t local_b8;
  uint local_a8 [15];
  TypeID local_6c;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  bVar6 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar6) {
    return;
  }
  pSVar10 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       (ib_type->member_types).
                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr[index].id)
  ;
  bVar12 = pSVar10->storage == StorageClassPhysicalStorageBuffer & pSVar10->pointer;
  if (pSVar10->basetype == Struct && bVar12 == 0) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,
               "Cannot perform any repacking for structs when it is used as a member of another struct."
              );
    goto LAB_001c74b3;
  }
  bVar6 = Compiler::is_scalar((Compiler *)this,ib_type);
  if (!bVar6) {
    Compiler::set_extended_member_decoration
              ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
               SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  bVar6 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar6) {
    return;
  }
  if (((pSVar10->array).super_VectorView<unsigned_int>.buffer_size != 0) &&
     (bVar6 = Compiler::is_matrix((Compiler *)this,pSVar10), !bVar6)) {
    uVar7 = Compiler::type_struct_member_array_stride((Compiler *)this,ib_type,index);
    iVar1 = (int)(pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
    if (iVar1 != 1) {
      index_00 = 0;
      do {
        uVar9 = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSVar10,index_00);
        uVar7 = uVar7 / (uVar9 + (uVar9 == 0));
        index_00 = index_00 + 1;
      } while (iVar1 - 1U != index_00);
    }
    uVar13 = 8;
    if (bVar12 == 0) {
      uVar13 = (ulong)(pSVar10->width >> 3);
    }
    uVar4 = uVar7 / uVar13;
    uVar11 = (ulong)uVar7 % uVar13;
    if (8 < (uint)uVar4) {
switchD_001c7014_caseD_5:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10,uVar13,uVar11);
      CompilerError::CompilerError
                (this_00,"Cannot represent vectors with more than 4 elements in MSL.");
      goto LAB_001c74b3;
    }
    uVar11 = (long)&switchD_001c7014::switchdataD_002f7858 +
             (long)(int)(&switchD_001c7014::switchdataD_002f7858)[uVar4];
    switch(uVar4) {
    case 3:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (this_00,"Cannot use ArrayStride of 3 elements in remapping scenarios.");
      goto LAB_001c74b3;
    case 5:
    case 6:
    case 7:
      goto switchD_001c7014_caseD_5;
    case 8:
      if (pSVar10->width != 0x10) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(this_00,"Unexpected type in std140 wide array resolve.");
        goto LAB_001c74b3;
      }
      add_spv_func_and_recompile(this,SPVFuncImplPaddedStd140);
    default:
      SPIRType::SPIRType((SPIRType *)local_180,pSVar10);
      local_6c.id = 0;
      if (bVar12 != 0) {
        local_180._16_4_ = UInt64;
        local_180._20_4_ = 0x40;
        local_180[0x7c] = false;
        local_180[0x7d] = false;
        local_180._120_4_ = 0;
      }
      local_180._24_4_ = (uint)uVar4;
      id.id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
      Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
                ((Compiler *)this,id.id,(SPIRType *)local_180);
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypeID,id.id);
      Compiler::set_decoration((Compiler *)this,id,DecorationArrayStride,uVar7);
      Compiler::unset_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypePacked);
      local_180._0_8_ = &PTR__SPIRType_003a8f58;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&local_68);
    }
    goto LAB_001c70ed;
  }
  bVar6 = Compiler::is_matrix((Compiler *)this,pSVar10);
  if (!bVar6) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Found a buffer packing case which we cannot represent in MSL.");
    goto LAB_001c74b3;
  }
  uVar7 = Compiler::type_struct_member_matrix_stride((Compiler *)this,ib_type,index);
  uVar13 = (ulong)uVar7 / (ulong)(pSVar10->width >> 3);
  uVar8 = (uint)uVar13;
  switch(uVar13) {
  case 0:
  case 1:
  case 2:
  case 4:
    break;
  case 3:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Cannot use ArrayStride of 3 elements in remapping scenarios.");
    goto LAB_001c74b3;
  default:
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError
              (this_00,"Cannot represent vectors with more than 4 elements in MSL.");
    goto LAB_001c74b3;
  case 8:
    if (pSVar10->basetype != Half) {
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Unexpected type in std140 wide matrix stride resolve.");
      goto LAB_001c74b3;
    }
    add_spv_func_and_recompile(this,SPVFuncImplPaddedStd140);
  }
  bVar6 = Compiler::has_member_decoration
                    ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,index,
                     DecorationRowMajor);
  SPIRType::SPIRType((SPIRType *)local_180,pSVar10);
  local_6c.id = 0;
  uVar5 = uVar8;
  if (bVar6) {
    uVar5 = local_180._24_4_;
    local_180._28_4_ = uVar8;
  }
  local_180._24_4_ = uVar5;
  uVar7 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  Compiler::set<spirv_cross::SPIRType,spirv_cross::SPIRType&>
            ((Compiler *)this,uVar7,(SPIRType *)local_180);
  Compiler::set_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
             SPIRVCrossDecorationPhysicalTypeID,uVar7);
  Compiler::unset_extended_member_decoration
            ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
             SPIRVCrossDecorationPhysicalTypePacked);
  local_180._0_8_ = &PTR__SPIRType_003a8f58;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
LAB_001c70ed:
  local_b8 = 0;
  if (local_c0 != local_a8) {
    free(local_c0);
  }
  local_180._144_8_ = 0;
  if ((TypedID<(spirv_cross::Types)1> *)local_180._136_8_ !=
      (TypedID<(spirv_cross::Types)1> *)(local_180 + 0xa0)) {
    free((void *)local_180._136_8_);
  }
  local_180._96_8_ = 0;
  if ((undefined1 *)local_180._88_8_ != local_180 + 0x70) {
    free((void *)local_180._88_8_);
  }
  local_180._40_8_ = 0;
  if ((undefined1 *)local_180._32_8_ != local_180 + 0x38) {
    free((void *)local_180._32_8_);
  }
  bVar6 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar6) {
    return;
  }
  uVar7 = Compiler::get_extended_member_decoration
                    ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                     SPIRVCrossDecorationPhysicalTypeID);
  pSVar10 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + uVar7);
  bVar6 = Compiler::is_array((Compiler *)this,pSVar10);
  if (bVar6) {
    puVar2 = (pSVar10->array).super_VectorView<unsigned_int>.ptr;
    sVar3 = (pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
    uVar8 = puVar2[sVar3 - 1];
    if (uVar8 < 2) {
      Compiler::unset_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypeID);
      Compiler::set_extended_member_decoration
                ((Compiler *)this,(ib_type->super_IVariant).self.id,index,
                 SPIRVCrossDecorationPhysicalTypePacked,0);
    }
    else {
      if ((pSVar10->array_size_literal).super_VectorView<bool>.ptr
          [(pSVar10->array_size_literal).super_VectorView<bool>.buffer_size - 1] == false) {
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError
                  (this_00,"Cannot apply scalar layout workaround with spec constant array size.");
        goto LAB_001c74b3;
      }
      puVar2[sVar3 - 1] = uVar8 - 1;
    }
  }
  else {
    bVar6 = Compiler::is_matrix((Compiler *)this,pSVar10);
    if (bVar6) {
      bVar6 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)(ib_type->super_IVariant).self.id,index,
                         DecorationRowMajor);
      if (bVar6) {
        uVar8 = pSVar10->vecsize;
        if (uVar8 < 3) {
          if (uVar8 == 2) {
            pSVar10->vecsize = pSVar10->columns;
            pSVar10->columns = 1;
            if ((pSVar10->array).super_VectorView<unsigned_int>.buffer_size != 0) {
              __assert_fail("type.array.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                            ,0x139e,
                            "void spirv_cross::CompilerMSL::ensure_member_packing_rules_msl(SPIRType &, uint32_t)"
                           );
            }
LAB_001c731a:
            *(undefined4 *)&(pSVar10->super_IVariant).field_0xc = 0x1c;
            SmallVector<unsigned_int,_8UL>::reserve(&pSVar10->array,1);
            sVar3 = (pSVar10->array).super_VectorView<unsigned_int>.buffer_size;
            (pSVar10->array).super_VectorView<unsigned_int>.ptr[sVar3] = 1;
            (pSVar10->array).super_VectorView<unsigned_int>.buffer_size = sVar3 + 1;
            SmallVector<bool,_8UL>::reserve
                      (&pSVar10->array_size_literal,
                       (pSVar10->array_size_literal).super_VectorView<bool>.buffer_size + 1);
            sVar3 = (pSVar10->array_size_literal).super_VectorView<bool>.buffer_size;
            (pSVar10->array_size_literal).super_VectorView<bool>.ptr[sVar3] = true;
            (pSVar10->array_size_literal).super_VectorView<bool>.buffer_size = sVar3 + 1;
          }
        }
        else {
          pSVar10->vecsize = uVar8 - 1;
        }
      }
      else {
        uVar8 = pSVar10->columns;
        if (uVar8 < 3) {
          if (uVar8 == 2) {
            pSVar10->columns = 1;
            if ((pSVar10->array).super_VectorView<unsigned_int>.buffer_size != 0) {
              __assert_fail("type.array.empty()",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Cross/spirv_msl.cpp"
                            ,0x138d,
                            "void spirv_cross::CompilerMSL::ensure_member_packing_rules_msl(SPIRType &, uint32_t)"
                           );
            }
            goto LAB_001c731a;
          }
        }
        else {
          pSVar10->columns = uVar8 - 1;
        }
      }
    }
  }
  bVar6 = validate_member_packing_rules_msl(this,ib_type,index);
  if (bVar6) {
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_00,"Found a buffer packing case which we cannot represent in MSL.");
LAB_001c74b3:
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerMSL::ensure_member_packing_rules_msl(SPIRType &ib_type, uint32_t index)
{
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We failed validation.
	// This case will be nightmare-ish to deal with. This could possibly happen if struct alignment does not quite
	// match up with what we want. Scalar block layout comes to mind here where we might have to work around the rule
	// that struct alignment == max alignment of all members and struct size depends on this alignment.
	// Can't repack structs, but can repack pointers to structs.
	auto &mbr_type = get<SPIRType>(ib_type.member_types[index]);
	bool is_buff_ptr = mbr_type.pointer && mbr_type.storage == StorageClassPhysicalStorageBuffer;
	if (mbr_type.basetype == SPIRType::Struct && !is_buff_ptr)
		SPIRV_CROSS_THROW("Cannot perform any repacking for structs when it is used as a member of another struct.");

	// Perform remapping here.
	// There is nothing to be gained by using packed scalars, so don't attempt it.
	if (!is_scalar(ib_type))
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);

	// Try validating again, now with packed.
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We're in deep trouble, and we need to create a new PhysicalType which matches up with what we expect.
	// A lot of work goes here ...
	// We will need remapping on Load and Store to translate the types between Logical and Physical.

	// First, we check if we have small vector std140 array.
	// We detect this if we have an array of vectors, and array stride is greater than number of elements.
	if (!mbr_type.array.empty() && !is_matrix(mbr_type))
	{
		uint32_t array_stride = type_struct_member_array_stride(ib_type, index);

		// Hack off array-of-arrays until we find the array stride per element we must have to make it work.
		uint32_t dimensions = uint32_t(mbr_type.array.size() - 1);
		for (uint32_t dim = 0; dim < dimensions; dim++)
			array_stride /= max<uint32_t>(to_array_size_literal(mbr_type, dim), 1u);

		// Pointers are 8 bytes
		uint32_t mbr_width_in_bytes = is_buff_ptr ? 8 : (mbr_type.width / 8);
		uint32_t elems_per_stride = array_stride / mbr_width_in_bytes;

		if (elems_per_stride == 3)
			SPIRV_CROSS_THROW("Cannot use ArrayStride of 3 elements in remapping scenarios.");
		else if (elems_per_stride > 4 && elems_per_stride != 8)
			SPIRV_CROSS_THROW("Cannot represent vectors with more than 4 elements in MSL.");

		if (elems_per_stride == 8)
		{
			if (mbr_type.width == 16)
				add_spv_func_and_recompile(SPVFuncImplPaddedStd140);
			else
				SPIRV_CROSS_THROW("Unexpected type in std140 wide array resolve.");
		}

		auto physical_type = mbr_type;
		physical_type.vecsize = elems_per_stride;
		physical_type.parent_type = 0;

		// If this is a physical buffer pointer, replace type with a ulongn vector.
		if (is_buff_ptr)
		{
			physical_type.width = 64;
			physical_type.basetype = to_unsigned_basetype(physical_type.width);
			physical_type.pointer = false;
			physical_type.pointer_depth = false;
			physical_type.forward_pointer = false;
		}

		uint32_t type_id = ir.increase_bound_by(1);
		set<SPIRType>(type_id, physical_type);
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID, type_id);
		set_decoration(type_id, DecorationArrayStride, array_stride);

		// Remove packed_ for vectors of size 1, 2 and 4.
		unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
	}
	else if (is_matrix(mbr_type))
	{
		// MatrixStride might be std140-esque.
		uint32_t matrix_stride = type_struct_member_matrix_stride(ib_type, index);

		uint32_t elems_per_stride = matrix_stride / (mbr_type.width / 8);

		if (elems_per_stride == 3)
			SPIRV_CROSS_THROW("Cannot use ArrayStride of 3 elements in remapping scenarios.");
		else if (elems_per_stride > 4 && elems_per_stride != 8)
			SPIRV_CROSS_THROW("Cannot represent vectors with more than 4 elements in MSL.");

		if (elems_per_stride == 8)
		{
			if (mbr_type.basetype != SPIRType::Half)
				SPIRV_CROSS_THROW("Unexpected type in std140 wide matrix stride resolve.");
			add_spv_func_and_recompile(SPVFuncImplPaddedStd140);
		}

		bool row_major = has_member_decoration(ib_type.self, index, DecorationRowMajor);
		auto physical_type = mbr_type;
		physical_type.parent_type = 0;

		if (row_major)
			physical_type.columns = elems_per_stride;
		else
			physical_type.vecsize = elems_per_stride;
		uint32_t type_id = ir.increase_bound_by(1);
		set<SPIRType>(type_id, physical_type);
		set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID, type_id);

		// Remove packed_ for vectors of size 1, 2 and 4.
		unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
	}
	else
		SPIRV_CROSS_THROW("Found a buffer packing case which we cannot represent in MSL.");

	// Try validating again, now with physical type remapping.
	if (validate_member_packing_rules_msl(ib_type, index))
		return;

	// We might have a particular odd scalar layout case where the last element of an array
	// does not take up as much space as the ArrayStride or MatrixStride. This can happen with DX cbuffers.
	// The "proper" workaround for this is extremely painful and essentially impossible in the edge case of float3[],
	// so we hack around it by declaring the offending array or matrix with one less array size/col/row,
	// and rely on padding to get the correct value. We will technically access arrays out of bounds into the padding region,
	// but it should spill over gracefully without too much trouble. We rely on behavior like this for unsized arrays anyways.

	// E.g. we might observe a physical layout of:
	// { float2 a[2]; float b; } in cbuffer layout where ArrayStride of a is 16, but offset of b is 24, packed right after a[1] ...
	uint32_t type_id = get_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID);
	auto &type = get<SPIRType>(type_id);

	// Modify the physical type in-place. This is safe since each physical type workaround is a copy.
	if (is_array(type))
	{
		if (type.array.back() > 1)
		{
			if (!type.array_size_literal.back())
				SPIRV_CROSS_THROW("Cannot apply scalar layout workaround with spec constant array size.");
			type.array.back() -= 1;
		}
		else
		{
			// We have an array of size 1, so we cannot decrement that. Our only option now is to
			// force a packed layout instead, and drop the physical type remap since ArrayStride is meaningless now.
			unset_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypeID);
			set_extended_member_decoration(ib_type.self, index, SPIRVCrossDecorationPhysicalTypePacked);
		}
	}
	else if (is_matrix(type))
	{
		bool row_major = has_member_decoration(ib_type.self, index, DecorationRowMajor);
		if (!row_major)
		{
			// Slice off one column. If we only have 2 columns, this might turn the matrix into a vector with one array element instead.
			if (type.columns > 2)
			{
				type.columns--;
			}
			else if (type.columns == 2)
			{
				type.columns = 1;
				assert(type.array.empty());
				type.op = OpTypeArray;
				type.array.push_back(1);
				type.array_size_literal.push_back(true);
			}
		}
		else
		{
			// Slice off one row. If we only have 2 rows, this might turn the matrix into a vector with one array element instead.
			if (type.vecsize > 2)
			{
				type.vecsize--;
			}
			else if (type.vecsize == 2)
			{
				type.vecsize = type.columns;
				type.columns = 1;
				assert(type.array.empty());
				type.op = OpTypeArray;
				type.array.push_back(1);
				type.array_size_literal.push_back(true);
			}
		}
	}

	// This better validate now, or we must fail gracefully.
	if (!validate_member_packing_rules_msl(ib_type, index))
		SPIRV_CROSS_THROW("Found a buffer packing case which we cannot represent in MSL.");
}